

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rename.c
# Opt level: O1

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  
  remove("test_support/testfile1");
  remove("test_support/testfile2");
  pFVar2 = fopen("test_support/testfile1","r");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x3d,"fopen( testfile1, \"r\" ) == NULL");
  }
  pFVar2 = fopen("test_support/testfile2","r");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x3e,"fopen( testfile2, \"r\" ) == NULL");
  }
  iVar1 = rename("test_support/testfile1","test_support/testfile2");
  if (iVar1 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x40,"rename( testfile1, testfile2 ) == -1");
  }
  pFVar2 = fopen("test_support/testfile1","w");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x42,"( file = fopen( testfile1, \"w\" ) ) != NULL");
  }
  iVar1 = fputs("x",pFVar2);
  if (iVar1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x43,"fputs( \"x\", file ) != EOF");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x44,"fclose( file ) == 0");
  }
  pFVar2 = fopen("test_support/testfile1","r");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x46,"( file = fopen( testfile1, \"r\" ) ) != NULL");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x47,"fclose( file ) == 0");
  }
  iVar1 = rename("test_support/testfile1","test_support/testfile2");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x49,"rename( testfile1, testfile2 ) == 0");
  }
  pFVar2 = fopen("test_support/testfile1","r");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x4b,"fopen( testfile1, \"r\" ) == NULL");
  }
  pFVar2 = fopen("test_support/testfile2","r");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x4c,"( file = fopen( testfile2, \"r\" ) ) != NULL");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x4d,"fclose( file ) == 0");
  }
  pFVar2 = fopen("test_support/testfile1","w");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x4f,"( file = fopen( testfile1, \"w\" ) ) != NULL");
  }
  iVar1 = fputs("x",pFVar2);
  if (iVar1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x50,"fputs( \"x\", file ) != EOF");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x51,"fclose( file ) == 0");
  }
  pFVar2 = fopen("test_support/testfile1","r");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x53,"( file = fopen( testfile1, \"r\" ) ) != NULL");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x54,"fclose( file ) == 0");
  }
  iVar1 = remove("test_support/testfile1");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x5f,"remove( testfile1 ) == 0");
  }
  iVar1 = remove("test_support/testfile2");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x60,"remove( testfile2 ) == 0");
  }
  pFVar2 = fopen("test_support/testfile1","r");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,0x62,"fopen( testfile1, \"r\" ) == NULL");
  }
  pFVar2 = fopen("test_support/testfile2","r");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/rename.c, line %d - %s\n"
           ,99,"fopen( testfile2, \"r\" ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * file;
    remove( testfile1 );
    remove( testfile2 );
    /* make sure that neither file exists */
    TESTCASE( fopen( testfile1, "r" ) == NULL );
    TESTCASE( fopen( testfile2, "r" ) == NULL );
    /* rename file 1 to file 2 - expected to fail */
    TESTCASE( rename( testfile1, testfile2 ) == -1 );
    /* create file 1 */
    TESTCASE( ( file = fopen( testfile1, "w" ) ) != NULL );
    TESTCASE( fputs( "x", file ) != EOF );
    TESTCASE( fclose( file ) == 0 );
    /* check that file 1 exists */
    TESTCASE( ( file = fopen( testfile1, "r" ) ) != NULL );
    TESTCASE( fclose( file ) == 0 );
    /* rename file 1 to file 2 */
    TESTCASE( rename( testfile1, testfile2 ) == 0 );
    /* check that file 2 exists, file 1 does not */
    TESTCASE( fopen( testfile1, "r" ) == NULL );
    TESTCASE( ( file = fopen( testfile2, "r" ) ) != NULL );
    TESTCASE( fclose( file ) == 0 );
    /* create another file 1 */
    TESTCASE( ( file = fopen( testfile1, "w" ) ) != NULL );
    TESTCASE( fputs( "x", file ) != EOF );
    TESTCASE( fclose( file ) == 0 );
    /* check that file 1 exists */
    TESTCASE( ( file = fopen( testfile1, "r" ) ) != NULL );
    TESTCASE( fclose( file ) == 0 );
    /* rename file 1 to file 2 - expected to fail, see comment in
       _PDCLIB_rename() itself.
    */
    /* Whether existing destination files are overwritten or not
       is implementation-defined.
       See functions/_PDCLIB/_PDCLIB_rename.c for your platform
       for details.
    */
    /*TESTCASE( rename( testfile1, testfile2 ) == [0|1] );*/
    /* remove both files */
    TESTCASE( remove( testfile1 ) == 0 );
    TESTCASE( remove( testfile2 ) == 0 );
    /* check that they're gone */
    TESTCASE( fopen( testfile1, "r" ) == NULL );
    TESTCASE( fopen( testfile2, "r" ) == NULL );
    return TEST_RESULTS;
}